

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

string * __thiscall
Catch::Generators::IGenerator<std::tuple<double,double,double>>::stringifyImpl_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined1 auVar1 [16];
  IGenerator<std::tuple<double,_double,_double>_> *this_local;
  
  auVar1 = (**(code **)(*this + 0x20))();
  Catch::Detail::stringify<std::tuple<double,double,double>>
            (__return_storage_ptr__,auVar1._0_8_,auVar1._8_8_);
  return __return_storage_ptr__;
}

Assistant:

std::string stringifyImpl() const override {
            return ::Catch::Detail::stringify( get() );
        }